

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O3

void __thiscall Imf_2_5::DwaCompressor::initializeBuffers(DwaCompressor *this,size_t *outBufferSize)

{
  CompressorScheme CVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  size_t sVar10;
  Zip *this_00;
  char *pcVar11;
  pointer pCVar12;
  NoImplExc *this_01;
  int iVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  int i;
  size_t maxRawSize;
  bool bVar18;
  float fVar19;
  float fVar20;
  int local_9c;
  int local_80 [4];
  float local_70;
  float local_6c;
  size_t *local_68;
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
  local_60;
  
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
  ::_Rb_tree(&local_60,
             (_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
              *)&this->_channels);
  classifyChannels(this,(ChannelList *)&local_60,&this->_channelData,&this->_cscSets);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
  ::~_Rb_tree(&local_60);
  iVar3 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
  fVar19 = ceilf((float)iVar3 * 0.125);
  fVar20 = ceilf((float)((this->_max[0] - this->_min[0]) + 1) * 0.125);
  iVar3 = (int)fVar20 * (int)fVar19 * 0x7e;
  iVar4 = (*(this->super_Compressor)._vptr_Compressor[2])();
  local_6c = ceilf((float)iVar4 * 0.125);
  local_70 = ceilf((float)((this->_max[0] - this->_min[0]) + 1) * 0.125);
  pCVar12 = (this->_channelData).
            super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_80[3] = iVar3;
  if ((this->_channelData).
      super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
      ._M_impl.super__Vector_impl_data._M_finish == pCVar12) {
    local_9c = 0x58;
    iVar4 = 0;
    lVar17 = 0;
    uVar14 = 0;
  }
  else {
    iVar13 = (int)fVar20 * (int)fVar19 * 0xfc + 0x10000;
    local_9c = 0;
    iVar8 = 0;
    iVar15 = 0;
    iVar4 = 0;
    uVar14 = 0;
    uVar16 = 1;
    local_68 = outBufferSize;
    do {
      CVar1 = pCVar12[uVar14].compression;
      if (CVar1 == UNKNOWN) {
        iVar6 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
        iVar5 = this->_max[0];
        iVar2 = this->_min[0];
        iVar7 = pixelTypeSize((this->_channelData).
                              super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar14].type);
        iVar15 = iVar15 + iVar7 * ((iVar5 - iVar2) + 1) * iVar6;
      }
      else if (CVar1 == RLE) {
        iVar6 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
        iVar5 = this->_max[0];
        iVar2 = this->_min[0];
        iVar7 = pixelTypeSize((this->_channelData).
                              super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar14].type);
        iVar8 = iVar8 + iVar7 * ((iVar5 - iVar2) + 1) * iVar6 * 2;
      }
      else {
        if (CVar1 != LOSSY_DCT) goto LAB_004a4a2a;
        iVar5 = compressBound((long)iVar3);
        if (iVar5 < iVar13) {
          iVar5 = iVar13;
        }
        local_9c = iVar5 + local_9c;
        iVar4 = iVar4 + 1;
      }
      pCVar12 = (this->_channelData).
                super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar14 = ((long)(this->_channelData).
                      super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar12 >> 3) *
               -0x79435e50d79435e5;
      bVar18 = uVar16 <= uVar14;
      lVar17 = uVar14 - uVar16;
      uVar14 = uVar16;
      uVar16 = (ulong)((int)uVar16 + 1);
    } while (bVar18 && lVar17 != 0);
    uVar14 = (ulong)iVar8;
    lVar17 = (long)iVar15;
    local_9c = local_9c + 0x58;
    outBufferSize = local_68;
  }
  iVar3 = (int)local_6c;
  iVar15 = (int)local_70;
  iVar8 = compressBound();
  iVar13 = compressBound(lVar17);
  maxRawSize = (size_t)(iVar15 * iVar3 * 2 * iVar4);
  if (this->_zip == (Zip *)0x0) {
    this_00 = (Zip *)operator_new(0x10);
    Zip::Zip(this_00,maxRawSize);
  }
  else {
    sVar10 = Zip::maxRawSize(this->_zip);
    this_00 = this->_zip;
    if (maxRawSize <= sVar10) goto LAB_004a4824;
    if (this_00 != (Zip *)0x0) {
      Zip::~Zip(this_00);
    }
    operator_delete(this_00,0x10);
    this_00 = (Zip *)operator_new(0x10);
    Zip::Zip(this_00,maxRawSize);
  }
  this->_zip = this_00;
LAB_004a4824:
  sVar10 = Zip::maxCompressedSize(this_00);
  *outBufferSize = (long)(local_9c + iVar8 + iVar13 + (int)sVar10);
  sVar10 = (size_t)(iVar4 * local_80[3]);
  if (this->_packedAcBufferSize < sVar10) {
    this->_packedAcBufferSize = sVar10;
    if (this->_packedAcBuffer != (char *)0x0) {
      operator_delete__(this->_packedAcBuffer);
      sVar10 = this->_packedAcBufferSize;
    }
    pcVar11 = (char *)operator_new__(sVar10);
    this->_packedAcBuffer = pcVar11;
  }
  if (this->_packedDcBufferSize < maxRawSize) {
    this->_packedDcBufferSize = maxRawSize;
    if (this->_packedDcBuffer != (char *)0x0) {
      operator_delete__(this->_packedDcBuffer);
      maxRawSize = this->_packedDcBufferSize;
    }
    pcVar11 = (char *)operator_new__(maxRawSize);
    this->_packedDcBuffer = pcVar11;
  }
  if (this->_rleBufferSize < uVar14) {
    this->_rleBufferSize = uVar14;
    if (this->_rleBuffer != (char *)0x0) {
      operator_delete__(this->_rleBuffer);
    }
    pcVar11 = (char *)operator_new__(uVar14);
    this->_rleBuffer = pcVar11;
  }
  local_80[2] = 0;
  local_80[0] = 0;
  local_80[1] = 0;
  pCVar12 = (this->_channelData).
            super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_channelData).
      super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
      ._M_impl.super__Vector_impl_data._M_finish != pCVar12) {
    iVar4 = 0;
    iVar3 = 0;
    uVar14 = 0;
    uVar16 = 1;
    do {
      CVar1 = pCVar12[uVar14].compression;
      if (CVar1 == UNKNOWN) {
        iVar15 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
        iVar8 = this->_max[0];
        iVar13 = this->_min[0];
        iVar5 = pixelTypeSize((this->_channelData).
                              super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar14].type);
        iVar3 = iVar3 + iVar5 * ((iVar8 - iVar13) + 1) * iVar15;
      }
      else if (CVar1 != LOSSY_DCT) {
        if (CVar1 != RLE) {
LAB_004a4a2a:
          this_01 = (NoImplExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::NoImplExc::NoImplExc(this_01,"Unhandled compression scheme case");
          __cxa_throw(this_01,&Iex_2_5::NoImplExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
        }
        iVar15 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
        iVar8 = this->_max[0];
        iVar13 = this->_min[0];
        iVar5 = pixelTypeSize((this->_channelData).
                              super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar14].type);
        iVar4 = iVar4 + iVar5 * ((iVar8 - iVar13) + 1) * iVar15;
      }
      pCVar12 = (this->_channelData).
                super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar14 = ((long)(this->_channelData).
                      super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar12 >> 3) *
               -0x79435e50d79435e5;
      bVar18 = uVar16 <= uVar14;
      lVar17 = uVar14 - uVar16;
      uVar14 = uVar16;
      uVar16 = (ulong)((int)uVar16 + 1);
    } while (bVar18 && lVar17 != 0);
    local_80[2] = iVar4;
    local_80[0] = iVar3;
    if (0 < iVar3) {
      uVar9 = compressBound(iVar3);
      local_80[0] = uVar9;
    }
  }
  lVar17 = 0;
  do {
    uVar14 = (ulong)local_80[lVar17];
    if (this->_planarUncBufferSize[lVar17] < uVar14) {
      this->_planarUncBufferSize[lVar17] = uVar14;
      if (this->_planarUncBuffer[lVar17] != (char *)0x0) {
        operator_delete__(this->_planarUncBuffer[lVar17]);
      }
      pcVar11 = (char *)operator_new__(uVar14);
      this->_planarUncBuffer[lVar17] = pcVar11;
    }
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  return;
}

Assistant:

void
DwaCompressor::initializeBuffers (size_t &outBufferSize)
{
    classifyChannels (_channels, _channelData, _cscSets);

    //
    // _outBuffer needs to be big enough to hold all our 
    // compressed data - which could vary depending on what sort
    // of channels we have. 
    //

    int maxOutBufferSize  = 0;
    int numLossyDctChans  = 0;
    int unknownBufferSize = 0;
    int rleBufferSize     = 0;

    int maxLossyDctAcSize = (int)ceil ((float)numScanLines() / 8.0f) * 
                            (int)ceil ((float)(_max[0] - _min[0] + 1) / 8.0f) *
                            63 * sizeof (unsigned short);

    int maxLossyDctDcSize = (int)ceil ((float)numScanLines() / 8.0f) * 
                            (int)ceil ((float)(_max[0] - _min[0] + 1) / 8.0f) *
                            sizeof (unsigned short);

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
    {
        switch (_channelData[chan].compression)
        {
          case LOSSY_DCT:

            //
            // This is the size of the number of packed
            // components, plus the requirements for
            // maximum Huffman encoding size (for STATIC_HUFFMAN)
            // or for zlib compression (for DEFLATE)
            //

            maxOutBufferSize += std::max(
                            (int)(2 * maxLossyDctAcSize + 65536),
                            (int)compressBound (maxLossyDctAcSize) );
            numLossyDctChans++;
            break;

          case RLE:
            {
                //
                // RLE, if gone horribly wrong, could double the size
                // of the source data.
                //

                int rleAmount = 2 * numScanLines() * (_max[0] - _min[0] + 1) *
                                OPENEXR_IMF_NAMESPACE::pixelTypeSize (_channelData[chan].type);

                rleBufferSize += rleAmount;
            }
            break;


          case UNKNOWN:

            unknownBufferSize += numScanLines() * (_max[0] - _min[0] + 1) *
                                 OPENEXR_IMF_NAMESPACE::pixelTypeSize (_channelData[chan].type);
            break;

          default:

            throw IEX_NAMESPACE::NoImplExc ("Unhandled compression scheme case");
            break;
        }
    }

    //
    // Also, since the results of the RLE are packed into 
    // the output buffer, we need the extra room there. But
    // we're going to zlib compress() the data we pack, 
    // which could take slightly more space
    //

    maxOutBufferSize += (int)compressBound ((uLongf)rleBufferSize);
    
    //
    // And the same goes for the UNKNOWN data
    //

    maxOutBufferSize += (int)compressBound ((uLongf)unknownBufferSize);

    //
    // Allocate a zip/deflate compressor big enought to hold the DC data
    // and include it's compressed results in the size requirements
    // for our output buffer
    //

    if (_zip == 0) 
        _zip = new Zip (maxLossyDctDcSize * numLossyDctChans);
    else if (_zip->maxRawSize() < static_cast<size_t>(maxLossyDctDcSize * numLossyDctChans))
    {
        delete _zip;
        _zip = new Zip (maxLossyDctDcSize * numLossyDctChans);
    }


    maxOutBufferSize += _zip->maxCompressedSize();

    //
    // We also need to reserve space at the head of the buffer to 
    // write out the size of our various packed and compressed data.
    //

    maxOutBufferSize += NUM_SIZES_SINGLE * sizeof (Int64); 
                    

    //
    // Later, we're going to hijack outBuffer for the result of
    // both encoding and decoding. So it needs to be big enough
    // to hold either a buffers' worth of uncompressed or
    // compressed data
    //
    // For encoding, we'll need _outBuffer to hold maxOutBufferSize bytes,
    // but for decoding, we only need it to be maxScanLineSize*numScanLines.
    // Cache the max size for now, and alloc the buffer when we either
    // encode or decode.
    //

    outBufferSize = maxOutBufferSize;


    //
    // _packedAcBuffer holds the quantized DCT coefficients prior
    // to Huffman encoding
    //

    if (static_cast<size_t>(maxLossyDctAcSize * numLossyDctChans) > _packedAcBufferSize)
    {
        _packedAcBufferSize = maxLossyDctAcSize * numLossyDctChans;
        if (_packedAcBuffer != 0) 
            delete[] _packedAcBuffer;
        _packedAcBuffer = new char[_packedAcBufferSize];
    }

    //
    // _packedDcBuffer holds one quantized DCT coef per 8x8 block
    //

    if (static_cast<size_t>(maxLossyDctDcSize * numLossyDctChans) > _packedDcBufferSize)
    {
        _packedDcBufferSize = maxLossyDctDcSize * numLossyDctChans;
        if (_packedDcBuffer != 0) 
            delete[] _packedDcBuffer;
        _packedDcBuffer     = new char[_packedDcBufferSize];
    }

    if (static_cast<size_t>(rleBufferSize) > _rleBufferSize) 
    {
        _rleBufferSize = rleBufferSize;
        if (_rleBuffer != 0) 
            delete[] _rleBuffer;
        _rleBuffer = new char[rleBufferSize];
    }

    // 
    // The planar uncompressed buffer will hold float data for LOSSY_DCT
    // compressed values, and whatever the native type is for other
    // channels. We're going to use this to hold data in a planar
    // format, as opposed to the native interleaved format we take
    // into compress() and give back from uncompress().
    //
    // This also makes it easier to compress the UNKNOWN and RLE data
    // all in one swoop (for each compression scheme).
    //

    int planarUncBufferSize[NUM_COMPRESSOR_SCHEMES];
    for (int i=0; i<NUM_COMPRESSOR_SCHEMES; ++i)
        planarUncBufferSize[i] = 0;

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
    {
        switch (_channelData[chan].compression)
        {
          case LOSSY_DCT:
            break;

          case RLE:
            planarUncBufferSize[RLE] +=
                     numScanLines() * (_max[0] - _min[0] + 1) *
                     OPENEXR_IMF_NAMESPACE::pixelTypeSize (_channelData[chan].type);
            break;

          case UNKNOWN: 
            planarUncBufferSize[UNKNOWN] +=
                     numScanLines() * (_max[0] - _min[0] + 1) *
                     OPENEXR_IMF_NAMESPACE::pixelTypeSize (_channelData[chan].type);
            break;

          default:
            throw IEX_NAMESPACE::NoImplExc ("Unhandled compression scheme case");
            break;
        }
    }

    //
    // UNKNOWN data is going to be zlib compressed, which needs 
    // a little extra headroom
    //

    if (planarUncBufferSize[UNKNOWN] > 0)
    {
        planarUncBufferSize[UNKNOWN] = 
            compressBound ((uLongf)planarUncBufferSize[UNKNOWN]);
    }

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
    {
        if (static_cast<size_t>(planarUncBufferSize[i]) > _planarUncBufferSize[i]) 
        {
            _planarUncBufferSize[i] = planarUncBufferSize[i];
            if (_planarUncBuffer[i] != 0) 
                delete[] _planarUncBuffer[i];
            _planarUncBuffer[i] = new char[planarUncBufferSize[i]];
        }
    }
}